

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::
     handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  basic_string_view<char> id;
  int iVar1;
  basic_format_context<fmt::v10::appender,_char> *in_RSI;
  int *in_RDI;
  int in_stack_00000008;
  undefined8 in_stack_ffffffffffffff68;
  basic_format_context<fmt::v10::appender,_char> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff84;
  
  if (in_stack_00000008 != 0) {
    if (in_stack_00000008 == 1) {
      get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      basic_format_context<fmt::v10::appender,_char>::error_handler(in_RSI);
      iVar1 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::error_handler>
                        ();
      *in_RDI = iVar1;
    }
    else if (in_stack_00000008 == 2) {
      id.size_._0_4_ = 2;
      id.data_ = (char *)&stack0x00000008;
      id.size_._4_4_ = in_stack_ffffffffffffff84;
      get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>>
                (in_stack_ffffffffffffff70,id);
      basic_format_context<fmt::v10::appender,_char>::error_handler(in_RSI);
      iVar1 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::error_handler>
                        ();
      *in_RDI = iVar1;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.index),
                                              ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.name),
                                              ctx.error_handler());
    break;
  }
}